

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QList<bool_(*)(void_**)>_>::data(QList<QList<bool_(*)(void_**)>_> *this)

{
  QArrayDataPointer<QList<bool_(*)(void_**)>_> *this_00;
  QList<bool_(*)(void_**)> *pQVar1;
  QArrayDataPointer<QList<bool_(*)(void_**)>_> *in_RDI;
  
  detach((QList<QList<bool_(*)(void_**)>_> *)0x2357dc);
  this_00 = (QArrayDataPointer<QList<bool_(*)(void_**)>_> *)
            QArrayDataPointer<QList<bool_(*)(void_**)>_>::operator->(in_RDI);
  pQVar1 = QArrayDataPointer<QList<bool_(*)(void_**)>_>::data(this_00);
  return pQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }